

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_Memcopy
               (Var dstInstance,int32 dstStart,Var srcInstance,int32 srcStart,int32 length,
               ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ThreadContext *threadContext;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  TypedArray<char,_false,_false> *this;
  TypedArray<char,_false,_false> *fromArray;
  TypedArray<unsigned_char,_false,_false> *this_00;
  TypedArray<unsigned_char,_false,_false> *fromArray_00;
  TypedArray<unsigned_char,_true,_false> *this_01;
  TypedArray<unsigned_char,_true,_false> *fromArray_01;
  TypedArray<short,_false,_false> *this_02;
  TypedArray<short,_false,_false> *fromArray_02;
  TypedArray<unsigned_short,_false,_false> *this_03;
  TypedArray<unsigned_short,_false,_false> *fromArray_03;
  TypedArray<int,_false,_false> *this_04;
  TypedArray<int,_false,_false> *fromArray_04;
  TypedArray<unsigned_int,_false,_false> *this_05;
  TypedArray<unsigned_int,_false,_false> *fromArray_05;
  TypedArray<float,_false,_false> *this_06;
  TypedArray<float,_false,_false> *fromArray_06;
  TypedArray<double,_false,_false> *this_07;
  TypedArray<double,_false,_false> *fromArray_07;
  JavascriptArray *fromArray_08;
  JavascriptArray *this_08;
  INT_PTR IVar6;
  INT_PTR IVar7;
  INT_PTR vt;
  JavascriptArray *dstArray;
  JavascriptArray *srcArray;
  BOOL returnValue;
  TypeId instanceType;
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  int32 length_local;
  int32 srcStart_local;
  Var srcInstance_local;
  int32 dstStart_local;
  Var dstInstance_local;
  TypeId local_34;
  TypeId local_28;
  TypeId typeId;
  TypeId typeId_1;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)&instanceType,threadContext);
  if (length < 1) {
    dstInstance_local._4_4_ = 0;
  }
  else {
    if (srcInstance == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar2 = TaggedInt::Is(srcInstance);
    if (bVar2) {
      local_28 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(srcInstance);
      if (bVar2) {
        local_28 = TypeIds_Number;
      }
      else {
        pRVar5 = UnsafeVarTo<Js::RecyclableObject>(srcInstance);
        if (pRVar5 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        local_28 = RecyclableObject::GetTypeId(pRVar5);
        if ((0x57 < (int)local_28) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
    }
    if (dstInstance == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar2 = TaggedInt::Is(dstInstance);
    if (bVar2) {
      local_34 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(dstInstance);
      if (bVar2) {
        local_34 = TypeIds_Number;
      }
      else {
        pRVar5 = UnsafeVarTo<Js::RecyclableObject>(dstInstance);
        if (pRVar5 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        local_34 = RecyclableObject::GetTypeId(pRVar5);
        if ((0x57 < (int)local_34) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
    }
    if (local_28 == local_34) {
      if (srcStart == dstStart) {
        srcArray._0_4_ = 0;
        switch(local_28) {
        case TypeIds_Array:
        case TypeIds_NativeIntArray:
        case TypeIds_ArrayLast:
          if ((-1 < dstStart) && (-1 < srcStart)) {
            fromArray_08 = UnsafeVarTo<Js::JavascriptArray>(srcInstance);
            this_08 = VarTo<Js::JavascriptArray>(dstInstance);
            bVar2 = ScriptContextOptimizationOverrideInfo::IsEnabledArraySetElementFastPath
                              ((ScriptContextOptimizationOverrideInfo *)
                               (reentrancylock._24_8_ + 0x40));
            if (bVar2) {
              IVar6 = VirtualTableInfoBase::GetVirtualTable(dstInstance);
              if (local_28 == TypeIds_Array) {
                bVar2 = Js::JavascriptArray::DirectSetItemAtRangeFromArray<void*>
                                  (this_08,dstStart,length,fromArray_08,srcStart);
              }
              else if (local_28 == TypeIds_NativeIntArray) {
                bVar2 = Js::JavascriptArray::DirectSetItemAtRangeFromArray<int>
                                  (this_08,dstStart,length,fromArray_08,srcStart);
              }
              else {
                bVar2 = Js::JavascriptArray::DirectSetItemAtRangeFromArray<double>
                                  (this_08,dstStart,length,fromArray_08,srcStart);
              }
              IVar7 = VirtualTableInfoBase::GetVirtualTable(dstInstance);
              srcArray._0_4_ = (uint)(byte)(IVar6 == IVar7 & bVar2);
            }
          }
          break;
        default:
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1439,"(false)",
                                      "We don\'t support this type for memcopy yet.");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
          break;
        case TypeIds_Int8Array:
          this = VarTo<Js::TypedArray<char,false,false>>(dstInstance);
          fromArray = VarTo<Js::TypedArray<char,false,false>>(srcInstance);
          srcArray._0_4_ =
               TypedArray<char,_false,_false>::DirectSetItemAtRange
                         (this,fromArray,srcStart,dstStart,length,JavascriptConversion::ToInt8);
          break;
        case TypeIds_Uint8Array:
          this_00 = VarTo<Js::TypedArray<unsigned_char,false,false>>(dstInstance);
          fromArray_00 = VarTo<Js::TypedArray<unsigned_char,false,false>>(srcInstance);
          srcArray._0_4_ =
               TypedArray<unsigned_char,_false,_false>::DirectSetItemAtRange
                         (this_00,fromArray_00,srcStart,dstStart,length,
                          JavascriptConversion::ToUInt8);
          break;
        case TypeIds_Uint8ClampedArray:
          this_01 = VarTo<Js::TypedArray<unsigned_char,true,false>>(dstInstance);
          fromArray_01 = VarTo<Js::TypedArray<unsigned_char,true,false>>(srcInstance);
          srcArray._0_4_ =
               TypedArray<unsigned_char,_true,_false>::DirectSetItemAtRange
                         (this_01,fromArray_01,srcStart,dstStart,length,
                          JavascriptConversion::ToUInt8Clamped);
          break;
        case TypeIds_Int16Array:
          this_02 = VarTo<Js::TypedArray<short,false,false>>(dstInstance);
          fromArray_02 = VarTo<Js::TypedArray<short,false,false>>(srcInstance);
          srcArray._0_4_ =
               TypedArray<short,_false,_false>::DirectSetItemAtRange
                         (this_02,fromArray_02,srcStart,dstStart,length,
                          JavascriptConversion::ToInt16);
          break;
        case TypeIds_Uint16Array:
          this_03 = VarTo<Js::TypedArray<unsigned_short,false,false>>(dstInstance);
          fromArray_03 = VarTo<Js::TypedArray<unsigned_short,false,false>>(srcInstance);
          srcArray._0_4_ =
               TypedArray<unsigned_short,_false,_false>::DirectSetItemAtRange
                         (this_03,fromArray_03,srcStart,dstStart,length,
                          JavascriptConversion::ToUInt16);
          break;
        case TypeIds_Int32Array:
          this_04 = VarTo<Js::TypedArray<int,false,false>>(dstInstance);
          fromArray_04 = VarTo<Js::TypedArray<int,false,false>>(srcInstance);
          srcArray._0_4_ =
               TypedArray<int,_false,_false>::DirectSetItemAtRange
                         (this_04,fromArray_04,srcStart,dstStart,length,
                          JavascriptConversion::ToInt32);
          break;
        case TypeIds_Uint32Array:
          this_05 = VarTo<Js::TypedArray<unsigned_int,false,false>>(dstInstance);
          fromArray_05 = VarTo<Js::TypedArray<unsigned_int,false,false>>(srcInstance);
          srcArray._0_4_ =
               TypedArray<unsigned_int,_false,_false>::DirectSetItemAtRange
                         (this_05,fromArray_05,srcStart,dstStart,length,
                          JavascriptConversion::ToUInt32);
          break;
        case TypeIds_Float32Array:
          this_06 = VarTo<Js::TypedArray<float,false,false>>(dstInstance);
          fromArray_06 = VarTo<Js::TypedArray<float,false,false>>(srcInstance);
          srcArray._0_4_ =
               TypedArray<float,_false,_false>::DirectSetItemAtRange
                         (this_06,fromArray_06,srcStart,dstStart,length,
                          JavascriptConversion::ToFloat);
          break;
        case TypeIds_Float64Array:
          this_07 = VarTo<Js::TypedArray<double,false,false>>(dstInstance);
          fromArray_07 = VarTo<Js::TypedArray<double,false,false>>(srcInstance);
          srcArray._0_4_ =
               TypedArray<double,_false,_false>::DirectSetItemAtRange
                         (this_07,fromArray_07,srcStart,dstStart,length,
                          JavascriptConversion::ToNumber);
        }
        dstInstance_local._4_4_ = (uint)srcArray;
      }
      else {
        dstInstance_local._4_4_ = 0;
      }
    }
    else {
      dstInstance_local._4_4_ = 0;
    }
  }
  JsReentLock::~JsReentLock((JsReentLock *)&instanceType);
  return dstInstance_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::OP_Memcopy(Var dstInstance, int32 dstStart, Var srcInstance, int32 srcStart, int32 length, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_Memcopy, reentrancylock, scriptContext->GetThreadContext());
        if (length <= 0)
        {
            return false;
        }

        TypeId instanceType = JavascriptOperators::GetTypeId(srcInstance);

        if (instanceType != JavascriptOperators::GetTypeId(dstInstance))
        {
            return false;
        }

        if (srcStart != dstStart)
        {
            return false;
        }

        BOOL  returnValue = false;
#define MEMCOPY_TYPED_ARRAY(type, conversion) VarTo< type ## >(dstInstance)->DirectSetItemAtRange( VarTo< type ## >(srcInstance), srcStart, dstStart, length, JavascriptConversion:: ## conversion)
        switch (instanceType)
        {
        case TypeIds_Int8Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Int8Array, ToInt8);
            break;
        }
        case TypeIds_Uint8Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Uint8Array, ToUInt8);
            break;
        }
        case TypeIds_Uint8ClampedArray:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Uint8ClampedArray, ToUInt8Clamped);
            break;
        }
        case TypeIds_Int16Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Int16Array, ToInt16);
            break;
        }
        case TypeIds_Uint16Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Uint16Array, ToUInt16);
            break;
        }
        case TypeIds_Int32Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Int32Array, ToInt32);
            break;
        }
        case TypeIds_Uint32Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Uint32Array, ToUInt32);
            break;
        }
        case TypeIds_Float32Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Float32Array, ToFloat);
            break;
        }
        case TypeIds_Float64Array:
        {
            returnValue = MEMCOPY_TYPED_ARRAY(Float64Array, ToNumber);
            break;
        }
        case TypeIds_Array:
        case TypeIds_NativeFloatArray:
        case TypeIds_NativeIntArray:
        {
            if (dstStart < 0 || srcStart < 0)
            {
                // This is not supported, Bailout
                break;
            }
            // Upper bounds check for source array
            JavascriptArray* srcArray = UnsafeVarTo<JavascriptArray>(srcInstance);
            JavascriptArray* dstArray = VarTo<JavascriptArray>(dstInstance);
            if (scriptContext->optimizationOverrides.IsEnabledArraySetElementFastPath())
            {
                INT_PTR vt = VirtualTableInfoBase::GetVirtualTable(dstInstance);
                if (instanceType == TypeIds_Array)
                {
                    returnValue = dstArray->DirectSetItemAtRangeFromArray<Var>(dstStart, length, srcArray, srcStart);
                }
                else if (instanceType == TypeIds_NativeIntArray)
                {
                    returnValue = dstArray->DirectSetItemAtRangeFromArray<int32>(dstStart, length, srcArray, srcStart);
                }
                else
                {
                    returnValue = dstArray->DirectSetItemAtRangeFromArray<double>(dstStart, length, srcArray, srcStart);
                }
                returnValue &= vt == VirtualTableInfoBase::GetVirtualTable(dstInstance);
            }
            break;
        }
        default:
            AssertMsg(false, "We don't support this type for memcopy yet.");
            break;
        }
#undef MEMCOPY_TYPED_ARRAY
        return returnValue;
        JIT_HELPER_END(Op_Memcopy);
    }